

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

JumpStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::JumpStatementSyntax,slang::syntax::JumpStatementSyntax_const&>
          (BumpAllocator *this,JumpStatementSyntax *args)

{
  JumpStatementSyntax *pJVar1;
  JumpStatementSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pJVar1 = (JumpStatementSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::JumpStatementSyntax::JumpStatementSyntax(in_RSI,pJVar1);
  return pJVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }